

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  Line *this;
  Rectangle *this_00;
  allocator<char> local_e9;
  string local_e8;
  Coordinate local_c4;
  Coordinate local_bc;
  Color local_b3;
  undefined1 local_b0 [8];
  shared_ptr<editor::figures::CanvasPrimitive> rectangle;
  Coordinate local_94;
  Color local_8b;
  undefined1 local_88 [8];
  shared_ptr<editor::figures::CanvasPrimitive> line;
  string local_70;
  undefined1 local_50 [8];
  CanvasController controller;
  MainView local_30;
  MainView view;
  GraphicDocument model;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"-- creating new document --");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  view.model = (GraphicDocument *)0x0;
  editor::GraphicDocument::GraphicDocument((GraphicDocument *)&view);
  editor::MainView::MainView(&local_30,(GraphicDocument *)&view);
  editor::CanvasController::CanvasController
            ((CanvasController *)local_50,(GraphicDocument *)&view,&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"-- loading document from file --");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"document.ed",
             (allocator<char> *)
             ((long)&line.
                     super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  editor::CanvasController::import_document((CanvasController *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&line.
                     super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  poVar1 = std::operator<<((ostream *)&std::cout,"-- adding line --");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this = (Line *)operator_new(0x20);
  editor::Color::Color(&local_8b,0xff,0xff,'\0');
  local_94.x = 0;
  local_94.y = 0;
  rectangle.super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 1;
  editor::figures::Line::Line
            (this,&local_8b,&local_94,
             (Coordinate *)
             ((long)&rectangle.
                     super___shared_ptr<editor::figures::CanvasPrimitive,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 4));
  std::shared_ptr<editor::figures::CanvasPrimitive>::shared_ptr<editor::figures::Line,void>
            ((shared_ptr<editor::figures::CanvasPrimitive> *)local_88,this);
  editor::CanvasController::add_primitive
            ((CanvasController *)local_50,(shared_ptr<editor::figures::CanvasPrimitive> *)local_88);
  poVar1 = std::operator<<((ostream *)&std::cout,"-- adding rectangle --");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = (Rectangle *)operator_new(0x20);
  editor::Color::Color(&local_b3,'\0',0xff,'\0');
  local_bc.x = 0x14;
  local_bc.y = 0x14;
  local_c4.x = 100;
  local_c4.y = 100;
  editor::figures::Rectangle::Rectangle(this_00,&local_b3,&local_bc,&local_c4);
  std::shared_ptr<editor::figures::CanvasPrimitive>::shared_ptr<editor::figures::Rectangle,void>
            ((shared_ptr<editor::figures::CanvasPrimitive> *)local_b0,this_00);
  editor::CanvasController::add_primitive
            ((CanvasController *)local_50,(shared_ptr<editor::figures::CanvasPrimitive> *)local_b0);
  poVar1 = std::operator<<((ostream *)&std::cout,"-- removing line --");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  editor::CanvasController::remove_primitive
            ((CanvasController *)local_50,(shared_ptr<editor::figures::CanvasPrimitive> *)local_88);
  poVar1 = std::operator<<((ostream *)&std::cout,"-- saving document to file --");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"document_modified.ed",&local_e9);
  editor::CanvasController::export_document((CanvasController *)local_50,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::shared_ptr<editor::figures::CanvasPrimitive>::~shared_ptr
            ((shared_ptr<editor::figures::CanvasPrimitive> *)local_b0);
  std::shared_ptr<editor::figures::CanvasPrimitive>::~shared_ptr
            ((shared_ptr<editor::figures::CanvasPrimitive> *)local_88);
  editor::GraphicDocument::~GraphicDocument((GraphicDocument *)&view);
  return 0;
}

Assistant:

int main() {
    std::cout << "-- creating new document --" << std::endl;
    editor::GraphicDocument model{}; // create new document
    editor::MainView view{model};
    editor::CanvasController controller(model, view);

    std::cout << "-- loading document from file --" << std::endl;
    controller.import_document("document.ed");

    namespace ef = editor::figures;
    std::cout << "-- adding line --" << std::endl;
    auto line = std::shared_ptr<ef::CanvasPrimitive>(
            new ef::Line{editor::Color{255, 255, 0}, editor::Coordinate{0, 0}, editor::Coordinate{1, 1}});
    controller.add_primitive(line);

    std::cout << "-- adding rectangle --" << std::endl;
    auto rectangle = std::shared_ptr<ef::CanvasPrimitive>(
            new ef::Rectangle{editor::Color{0, 255, 0}, editor::Coordinate{20, 20}, editor::Coordinate{100, 100}});
    controller.add_primitive(rectangle);

    std::cout << "-- removing line --" << std::endl;
    controller.remove_primitive(line);

    std::cout << "-- saving document to file --" << std::endl;
    controller.export_document("document_modified.ed");

    return 0;
}